

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_SetupRecipientWrongLengthEnc_Test::TestBody
          (HPKETest_SetupRecipientWrongLengthEnc_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  char *in_R9;
  char *expected_predicate_value;
  AssertHelper local_3b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3b0;
  AssertionResult gtest_ar__1;
  string local_398;
  uint8_t bogus_enc [37];
  ScopedEVP_HPKE_KEY key;
  ScopedEVP_HPKE_CTX recipient_ctx;
  
  EVP_HPKE_KEY_zero(&key.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&key.ctx_,kem);
  bogus_enc[8] = '\0';
  bogus_enc[9] = '\0';
  bogus_enc[10] = '\0';
  bogus_enc[0xb] = '\0';
  bogus_enc[0xc] = '\0';
  bogus_enc[0xd] = '\0';
  bogus_enc[0xe] = '\0';
  bogus_enc[0xf] = '\0';
  bogus_enc[0] = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&recipient_ctx,(internal *)bogus_enc,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x262,(char *)recipient_ctx.ctx_.kem);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&recipient_ctx);
    if ((long *)local_398._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_398._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(bogus_enc + 8));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(bogus_enc + 8));
    bogus_enc[8] = '\0';
    bogus_enc[9] = '\0';
    bogus_enc[10] = '\0';
    bogus_enc[0xb] = '\0';
    bogus_enc[0xc] = '\0';
    bogus_enc[0xd] = '\0';
    bogus_enc[0xe] = '\0';
    bogus_enc[0xf] = '\0';
    bogus_enc[0x10] = '\0';
    bogus_enc[0x11] = '\0';
    bogus_enc[0x12] = '\0';
    bogus_enc[0x13] = '\0';
    bogus_enc[0x14] = '\0';
    bogus_enc[0x15] = '\0';
    bogus_enc[0x16] = '\0';
    bogus_enc[0x17] = '\0';
    bogus_enc[0x18] = '\0';
    bogus_enc[0x19] = '\0';
    bogus_enc[0x1a] = '\0';
    bogus_enc[0x1b] = '\0';
    bogus_enc[0x1c] = '\0';
    bogus_enc[0x1d] = '\0';
    bogus_enc[0x1e] = '\0';
    bogus_enc[0x1f] = '\0';
    bogus_enc[0x20] = '\0';
    bogus_enc[0x21] = '\0';
    bogus_enc[0x22] = '\0';
    bogus_enc[0x23] = '\0';
    bogus_enc[0x24] = '\0';
    bogus_enc[0] = 0xff;
    bogus_enc[1] = '\0';
    bogus_enc[2] = '\0';
    bogus_enc[3] = '\0';
    bogus_enc[4] = '\0';
    bogus_enc[5] = '\0';
    bogus_enc[6] = '\0';
    bogus_enc[7] = '\0';
    EVP_HPKE_CTX_zero(&recipient_ctx.ctx_);
    kdf = EVP_hpke_hkdf_sha256();
    aead = EVP_hpke_aes_128_gcm();
    expected_predicate_value = (char *)0x25;
    iVar1 = EVP_HPKE_CTX_setup_recipient
                      (&recipient_ctx.ctx_,&key.ctx_,kdf,aead,bogus_enc,0x25,(uint8_t *)0x0,0);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (gtest_ar__1.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      uVar2 = ERR_get_error();
      ErrorEquals((uint32_t)&gtest_ar__1,(int)uVar2,6);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&local_3b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_398,(internal *)&gtest_ar__1,
                   (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 134)","false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x26b,local_398._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        if (local_3b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_3b0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      ERR_clear_error();
    }
    else {
      testing::Message::Message((Message *)&local_3b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_398,(internal *)&gtest_ar__1,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0)"
                 ,"true","false",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x269,local_398._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
      testing::internal::AssertHelper::~AssertHelper(&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      if (local_3b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3b0._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
    }
    internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
    ~StackAllocated(&recipient_ctx);
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
  return;
}

Assistant:

TEST(HPKETest, SetupRecipientWrongLengthEnc) {
  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  const uint8_t bogus_enc[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};

  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}